

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall
nuraft::asio_rpc_client::send_retry
          (asio_rpc_client *this,ptr<asio_rpc_client> *self,ptr<asio::steady_timer> *timer,
          ptr<req_msg> *req,rpc_handler *when_done,uint64_t send_timeout_ms,error_code *err)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  __int_type _Var4;
  element_type *peVar5;
  undefined8 uVar6;
  undefined8 in_RCX;
  long *in_RDI;
  undefined8 in_R8;
  char *pcVar7;
  undefined8 in_R9;
  error_code *in_stack_00000008;
  ptr<rpc_exception> except;
  ptr<resp_msg> rsp;
  char *in_stack_fffffffffffffe58;
  strfmt<200> *in_stack_fffffffffffffe60;
  shared_ptr<nuraft::resp_msg> *in_stack_fffffffffffffe68;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *in_stack_fffffffffffffe70;
  strfmt<200> local_178;
  char *local_a8;
  shared_ptr<nuraft::resp_msg> local_80 [3];
  string local_50 [32];
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  bVar1 = std::error_code::operator_cast_to_bool(in_stack_00000008);
  if ((bVar1) ||
     (_Var4 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffe68), 5 < _Var4)) {
    bVar1 = std::error_code::operator_cast_to_bool(in_stack_00000008);
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x62));
      if (bVar1) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x25ec09);
        iVar3 = (*peVar5->_vptr_logger[7])();
        if (1 < iVar3) {
          in_stack_fffffffffffffe70 =
               (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                *)std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x25ec2c);
          uVar2 = std::error_code::value(in_stack_00000008);
          msg_if_given_abi_cxx11_
                    ((char *)local_50,"error happened during async wait: %d",(ulong)uVar2);
          (*(*(_func_int ***)&(in_stack_fffffffffffffe70->super__Function_base)._M_functor)[8])
                    (in_stack_fffffffffffffe70,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                     ,"send_retry",0x3ce,local_50);
          std::__cxx11::string::~string(local_50);
        }
      }
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x62));
      if (bVar1) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x25ecee);
        iVar3 = (*peVar5->_vptr_logger[7])();
        if (1 < iVar3) {
          in_stack_fffffffffffffe60 =
               (strfmt<200> *)
               std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x25ed11);
          in_stack_fffffffffffffe58 = (char *)std::__cxx11::string::c_str();
          uVar6 = std::__cxx11::string::c_str();
          pcVar7 = "disabled";
          if ((*(byte *)(in_RDI + 0x4f) & 1) != 0) {
            pcVar7 = "enabled";
          }
          in_stack_fffffffffffffe68 = local_80;
          msg_if_given_abi_cxx11_
                    ((char *)in_stack_fffffffffffffe68,"connection to %s:%s timeout (SSL %s)",
                     in_stack_fffffffffffffe58,uVar6,pcVar7);
          (*(*(_func_int ***)in_stack_fffffffffffffe60->buf_)[8])
                    (in_stack_fffffffffffffe60,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                     ,"send_retry",0x3d2,in_stack_fffffffffffffe68);
          std::__cxx11::string::~string((string *)local_80);
        }
      }
    }
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_fffffffffffffe60,
               SUB81((ulong)in_stack_fffffffffffffe58 >> 0x38,0));
    std::shared_ptr<nuraft::resp_msg>::shared_ptr((shared_ptr<nuraft::resp_msg> *)0x25ee08);
    strfmt<200>::strfmt(&local_178,"timeout while connecting to %s");
    std::__cxx11::string::c_str();
    local_a8 = strfmt<200>::fmt<char_const*>(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    cs_new<nuraft::rpc_exception,char_const*,std::shared_ptr<nuraft::req_msg>&>
              ((char **)in_stack_fffffffffffffe68,
               (shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffffe60);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
               (shared_ptr<nuraft::rpc_exception> *)in_stack_fffffffffffffe60);
    std::shared_ptr<nuraft::rpc_exception>::~shared_ptr
              ((shared_ptr<nuraft::rpc_exception> *)0x25ee8c);
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x25ee99);
  }
  else {
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_20,local_28,local_30);
  }
  return;
}

Assistant:

void send_retry( ptr<asio_rpc_client> self,
                     ptr<asio::steady_timer> timer,
                     ptr<req_msg>& req,
                     rpc_handler& when_done,
                     uint64_t send_timeout_ms,
                     const ERROR_CODE& err )
    {
        if ( err || num_send_fails_ >= SEND_RETRY_MAX ) {
            if (err) {
                p_er("error happened during async wait: %d", err.value());
            } else {
                p_er( "connection to %s:%s timeout (SSL %s)",
                      host_.c_str(), port_.c_str(),
                      ( ssl_enabled_ ? "enabled" : "disabled" ) );
            }
            abandoned_= true;
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
               ( cs_new<rpc_exception>
                       ( lstrfmt("timeout while connecting to %s")
                                .fmt(host_.c_str()),
                         req ) );
            when_done(rsp, except);
            return;
        }
        send(req, when_done, send_timeout_ms);
    }